

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiMesh *pMesh,aiBone *pBone,float *afSum)

{
  float fVar1;
  uint uVar2;
  uint local_2c;
  uint i;
  float *afSum_local;
  aiBone *pBone_local;
  aiMesh *pMesh_local;
  ValidateDSProcess *this_local;
  
  Validate(this,&pBone->mName);
  local_2c = 0;
  while( true ) {
    if (pBone->mNumWeights <= local_2c) {
      return;
    }
    if (pMesh->mNumVertices <= pBone->mWeights[local_2c].mVertexId) break;
    fVar1 = pBone->mWeights[local_2c].mWeight;
    if (((fVar1 == 0.0) && (!NAN(fVar1))) || (1.0 < pBone->mWeights[local_2c].mWeight)) {
      ReportWarning(this,"aiBone::mWeights[%i].mWeight has an invalid value",(ulong)local_2c);
    }
    uVar2 = pBone->mWeights[local_2c].mVertexId;
    afSum[uVar2] = pBone->mWeights[local_2c].mWeight + afSum[uVar2];
    local_2c = local_2c + 1;
  }
  ReportError(this,"aiBone::mWeights[%i].mVertexId is out of range",(ulong)local_2c);
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh, const aiBone* pBone,float* afSum) {
    this->Validate(&pBone->mName);

    if (!pBone->mNumWeights)    {
        //ReportError("aiBone::mNumWeights is zero");
    }

    // check whether all vertices affected by this bone are valid
    for (unsigned int i = 0; i < pBone->mNumWeights;++i)
    {
        if (pBone->mWeights[i].mVertexId >= pMesh->mNumVertices)    {
            ReportError("aiBone::mWeights[%i].mVertexId is out of range",i);
        }
        else if (!pBone->mWeights[i].mWeight || pBone->mWeights[i].mWeight > 1.0f)  {
            ReportWarning("aiBone::mWeights[%i].mWeight has an invalid value",i);
        }
        afSum[pBone->mWeights[i].mVertexId] += pBone->mWeights[i].mWeight;
    }
}